

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall
crnlib::vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_>::reserve
          (vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> *this,uint new_capacity)

{
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar1;
  undefined8 uVar2;
  long lVar3;
  uint min_new_capacity;
  uint uVar4;
  vector<std::pair<crnlib::vec<2U,_float>,_unsigned_int>_> local_28;
  
  if (new_capacity <= this->m_capacity) {
    if (new_capacity < this->m_capacity) {
      local_28.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
      local_28.m_size = 0;
      local_28.m_capacity = 0;
      if (new_capacity < this->m_size) {
        new_capacity = this->m_size;
      }
      elemental_vector::increase_capacity
                ((elemental_vector *)&local_28,new_capacity,false,0xc,object_mover,false);
      if (&local_28 == this) {
        min_new_capacity = local_28.m_size;
      }
      else {
        min_new_capacity = this->m_size;
        if (local_28.m_capacity < min_new_capacity) {
          if (local_28.m_p != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
            crnlib_free(local_28.m_p);
            local_28.m_p = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0;
            local_28.m_size = 0;
            local_28.m_capacity = 0;
            min_new_capacity = this->m_size;
          }
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_28,min_new_capacity,false,0xc,object_mover,false);
          min_new_capacity = this->m_size;
        }
        if (min_new_capacity != 0) {
          ppVar1 = this->m_p;
          lVar3 = 0;
          uVar4 = min_new_capacity;
          do {
            *(undefined4 *)((long)((local_28.m_p)->first).m_s + lVar3) =
                 *(undefined4 *)((long)(ppVar1->first).m_s + lVar3);
            *(undefined4 *)((long)((local_28.m_p)->first).m_s + lVar3 + 4) =
                 *(undefined4 *)((long)(ppVar1->first).m_s + lVar3 + 4);
            *(undefined4 *)((long)(&(local_28.m_p)->first + 1) + lVar3) =
                 *(undefined4 *)((long)(&ppVar1->first + 1) + lVar3);
            lVar3 = lVar3 + 0xc;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
      }
      ppVar1 = this->m_p;
      this->m_p = local_28.m_p;
      uVar2._0_4_ = this->m_size;
      uVar2._4_4_ = this->m_capacity;
      this->m_size = min_new_capacity;
      this->m_capacity = local_28.m_capacity;
      if (ppVar1 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)0x0) {
        local_28.m_p = ppVar1;
        local_28._8_8_ = uVar2;
        crnlib_free(ppVar1);
      }
    }
    return;
  }
  elemental_vector::increase_capacity
            ((elemental_vector *)this,new_capacity,false,0xc,object_mover,false);
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            if (new_capacity > m_capacity)
            {
                increase_capacity(new_capacity, false);
            }
            else if (new_capacity < m_capacity)
            {
                // Must work around the lack of a "decrease_capacity()" method.
                // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
                vector tmp;
                tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
                tmp = *this;
                swap(tmp);
            }
        }